

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

nes_time_t __thiscall
Nes_Triangle::maintain_phase
          (Nes_Triangle *this,nes_time_t time,nes_time_t end_time,nes_time_t timer_period)

{
  int iVar1;
  int count;
  nes_time_t remain;
  nes_time_t timer_period_local;
  nes_time_t end_time_local;
  nes_time_t time_local;
  Nes_Triangle *this_local;
  
  time_local = time;
  if (0 < end_time - time) {
    iVar1 = ((end_time - time) + timer_period + -1) / timer_period;
    this->phase = (this->phase + 1) - iVar1 & 0x1f;
    this->phase = this->phase + 1;
    time_local = iVar1 * timer_period + time;
  }
  return time_local;
}

Assistant:

inline nes_time_t Nes_Triangle::maintain_phase( nes_time_t time, nes_time_t end_time,
		nes_time_t timer_period )
{
	nes_time_t remain = end_time - time;
	if ( remain > 0 )
	{
		int count = (remain + timer_period - 1) / timer_period;
		phase = ((unsigned) phase + 1 - count) & (phase_range * 2 - 1);
		phase++;
		time += (blargg_long) count * timer_period;
	}
	return time;
}